

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KdTree.cpp
# Opt level: O3

void __thiscall RVO::KdTree::~KdTree(KdTree *this)

{
  pointer pAVar1;
  pointer ppAVar2;
  
  deleteObstacleTree(this,this->obstacleTree_);
  pAVar1 = (this->agentTree_).
           super__Vector_base<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pAVar1 != (pointer)0x0) {
    operator_delete(pAVar1,(long)(this->agentTree_).
                                 super__Vector_base<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pAVar1);
  }
  ppAVar2 = (this->agents_).super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppAVar2 != (pointer)0x0) {
    operator_delete(ppAVar2,(long)(this->agents_).
                                  super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppAVar2)
    ;
    return;
  }
  return;
}

Assistant:

KdTree::~KdTree()
	{
		deleteObstacleTree(obstacleTree_);
	}